

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  QLatin1String *pQVar1;
  byte bVar2;
  long lVar3;
  QString *pQVar4;
  long lVar5;
  char16_t *pcVar6;
  QChar *pQVar7;
  QChar *__dest;
  
  lVar3 = (p->a).a.a.a.a.a.m_size;
  QAbstractConcatenable::appendLatin1To((p->a).a.a.a.a.a,*out);
  pQVar7 = *out + lVar3;
  *out = pQVar7;
  pQVar4 = (p->a).a.a.a.a.b;
  lVar3 = (pQVar4->d).size;
  if (lVar3 != 0) {
    pcVar6 = (pQVar4->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar7,pcVar6,lVar3 * 2);
    pQVar7 = *out;
  }
  *out = pQVar7 + lVar3;
  pQVar1 = &(p->a).a.a.a.b;
  lVar5 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar7 + lVar3);
  pQVar7 = *out;
  *out = pQVar7 + lVar5;
  bVar2 = (p->a).a.a.b.ch;
  pQVar7 = pQVar7 + lVar5 + 1;
  *out = pQVar7;
  pQVar7[-1].ucs = (ushort)bVar2;
  lVar3 = (p->a).a.b.d.size;
  if (lVar3 != 0) {
    pcVar6 = (p->a).a.b.d.ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar7,pcVar6,lVar3 * 2);
    pQVar7 = *out;
  }
  *out = pQVar7 + lVar3;
  bVar2 = (p->a).b.ch;
  __dest = pQVar7 + lVar3 + 1;
  *out = __dest;
  pQVar7[lVar3].ucs = (ushort)bVar2;
  lVar3 = (p->b->d).size;
  if (lVar3 != 0) {
    pcVar6 = (p->b->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,pcVar6,lVar3 * 2);
    __dest = *out;
  }
  *out = __dest + lVar3;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }